

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::JobManager::PrepareStartJobs
          (Error *__return_storage_ptr__,JobManager *this,Expression *aExpr,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *aNids,bool aGroupAlias)

{
  ErrorCode EVar1;
  uint64_t uVar2;
  CommissionerPool *this_00;
  bool bVar3;
  char cVar4;
  iterator iVar5;
  Error *pEVar6;
  __shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2> *this_01;
  string *aMessage;
  pointer __k;
  pointer puVar7;
  Expression expr;
  BorderRouter br;
  Config conf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_368;
  undefined1 local_350 [8];
  string local_348;
  Expression *local_328;
  pointer local_320;
  CommissionerPool *local_318;
  string *local_310;
  _Base_ptr local_308;
  Config *local_300;
  string local_2f8;
  string local_2d8;
  BorderRouter local_2b8;
  Config local_130;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  local_310 = (string *)&__return_storage_ptr__->mMessage;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_328 = aExpr;
  utils::ToLower((string *)&local_2b8,
                 (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start);
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_2b8,"start");
  std::__cxx11::string::~string((string *)&local_2b8);
  if (!bVar3) {
    __assert_fail("condition",
                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager.cpp"
                  ,0xca,
                  "Error ot::commissioner::JobManager::PrepareStartJobs(const Interpreter::Expression &, const std::vector<uint64_t> &, bool)"
                 );
  }
  if ((long)(local_328->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(local_328->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start != 0x20) {
    __assert_fail("condition",
                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager.cpp"
                  ,0xd0,
                  "Error ot::commissioner::JobManager::PrepareStartJobs(const Interpreter::Expression &, const std::vector<uint64_t> &, bool)"
                 );
  }
  __k = (aNids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start;
  puVar7 = (aNids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_300 = &this->mDefaultConf;
  local_318 = &this->mCommissionerPool;
  local_308 = &(this->mCommissionerPool)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_320 = puVar7;
  do {
    if (__k == puVar7) {
      return __return_storage_ptr__;
    }
    persistent_storage::BorderRouter::BorderRouter(&local_2b8);
    Config::Config(&local_130,local_300);
    PrepareDtlsConfig((Error *)local_350,this,*__k,&local_130);
    Error::operator=(__return_storage_ptr__,(Error *)local_350);
    std::__cxx11::string::~string((string *)(local_350 + 8));
    local_350._0_4_ = kNone;
    local_348._M_dataplus._M_p = local_350 + 0x18;
    local_348._M_string_length = 0;
    local_348.field_2._M_local_buf[0] = '\0';
    EVar1 = __return_storage_ptr__->mCode;
    std::__cxx11::string::~string((string *)(local_350 + 8));
    if (EVar1 == kNone) {
      iVar5 = std::
              _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>_>
              ::find(&local_318->_M_t,__k);
      if (iVar5._M_node == local_308) {
        local_368.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_368.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        CommissionerAppCreate
                  ((Error *)local_350,(shared_ptr<ot::commissioner::CommissionerApp> *)&local_368,
                   &local_130);
        pEVar6 = Error::operator=(__return_storage_ptr__,(Error *)local_350);
        EVar1 = pEVar6->mCode;
        std::__cxx11::string::~string((string *)(local_350 + 8));
        this_00 = local_318;
        if (EVar1 == kNone) {
          this_01 = &std::
                     map<unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>_>
                     ::operator[](local_318,__k)->
                     super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
          ;
          std::__shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>::
          operator=(this_01,(__shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                             *)&local_368);
          iVar5 = std::
                  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>_>
                  ::find(&this_00->_M_t,__k);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_368.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        puVar7 = local_320;
        if (EVar1 != kNone) goto LAB_001416b1;
      }
      cVar4 = (**(code **)(*(long *)iVar5._M_node[1]._M_parent + 0x78))();
      if (cVar4 == '\0') {
        MakeBorderRouterChoice((Error *)local_350,this,*__k,&local_2b8);
        pEVar6 = Error::operator=(__return_storage_ptr__,(Error *)local_350);
        EVar1 = pEVar6->mCode;
        std::__cxx11::string::~string((string *)(local_350 + 8));
        puVar7 = local_320;
        if (EVar1 != kNone) {
LAB_001416b1:
          Config::~Config(&local_130);
          persistent_storage::BorderRouter::~BorderRouter(&local_2b8);
          return __return_storage_ptr__;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_368,local_328);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_368,&local_2b8.mAgent.mAddr);
        std::__cxx11::to_string((string *)local_350,(uint)local_2b8.mAgent.mPort);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_368,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350);
        std::__cxx11::string::~string((string *)local_350);
        if ((long)local_368.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_368.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0x60) {
          __assert_fail("condition",
                        "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager.cpp"
                        ,0xf7,
                        "Error ot::commissioner::JobManager::PrepareStartJobs(const Interpreter::Expression &, const std::vector<uint64_t> &, bool)"
                       );
        }
        CreateJob((Error *)local_350,this,(CommissionerAppPtr *)&iVar5._M_node[1]._M_parent,
                  &local_368,*__k);
        pEVar6 = Error::operator=(__return_storage_ptr__,(Error *)local_350);
        EVar1 = pEVar6->mCode;
        std::__cxx11::string::~string((string *)(local_350 + 8));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_368);
        if (EVar1 != kNone) goto LAB_001416b1;
      }
      else if (!aGroupAlias) {
        uVar2 = *__k;
        aMessage = &local_2f8;
        std::__cxx11::string::string((string *)aMessage,"already started",(allocator *)local_350);
        InfoMsg(this,uVar2,aMessage);
        goto LAB_001414cc;
      }
    }
    else {
      uVar2 = *__k;
      std::__cxx11::string::string((string *)&local_2d8,local_310);
      ErrorMsg(this,uVar2,&local_2d8);
      std::__cxx11::string::~string((string *)&local_2d8);
      local_350._0_4_ = kNone;
      local_348._M_dataplus._M_p = local_350 + 0x18;
      local_348._M_string_length = 0;
      local_348.field_2._M_local_buf[0] = '\0';
      Error::operator=(__return_storage_ptr__,(Error *)local_350);
      aMessage = (string *)(local_350 + 8);
LAB_001414cc:
      std::__cxx11::string::~string((string *)aMessage);
    }
    Config::~Config(&local_130);
    persistent_storage::BorderRouter::~BorderRouter(&local_2b8);
    __k = __k + 1;
  } while( true );
}

Assistant:

Error JobManager::PrepareStartJobs(const Interpreter::Expression &aExpr,
                                   const std::vector<uint64_t>   &aNids,
                                   bool                           aGroupAlias)
{
    Error error = ERROR_NONE;

    ASSERT(utils::ToLower(aExpr[0]) == "start");
    /*
     * Coming here is a result of using multi-network syntax.
     * Therefore, no extra arguments to be used, otherwise it
     * is multi-network syntax violation.
     */
    ASSERT(aExpr.size() == 1);

    for (const auto &nid : aNids)
    {
        BorderRouter br;
        Config       conf = mDefaultConf;

        error = PrepareDtlsConfig(nid, conf);
        if (error != ERROR_NONE)
        {
            ErrorMsg(nid, error.GetMessage());
            error = ERROR_NONE;
            continue;
        }
        {
            auto entry = mCommissionerPool.find(nid);
            if (entry == mCommissionerPool.end())
            {
                CommissionerAppPtr commissioner;

                SuccessOrExit(error = CommissionerAppCreate(commissioner, conf));
                mCommissionerPool[nid] = commissioner;
                entry                  = mCommissionerPool.find(nid);
            }

            bool active = entry->second->IsActive();
            if (active)
            {
                if (!aGroupAlias)
                {
                    InfoMsg(nid, "already started");
                }
                continue;
            }

            SuccessOrExit(error = MakeBorderRouterChoice(nid, br));
            auto expr = aExpr;
            expr.push_back(br.mAgent.mAddr);
            expr.push_back(std::to_string(br.mAgent.mPort));
            ASSERT(expr.size() == 3); // 'start br_addr br_port'
            SuccessOrExit(error = CreateJob(entry->second, expr, nid));
        }
    }
exit:
    return error;
}